

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start,bool type)

{
  bool bVar1;
  int iVar2;
  uint in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  int mid;
  int hi;
  int lo;
  int tmp;
  int pivotkey;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined4 in_stack_fffffffffffffe64;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffeac;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  int *in_stack_fffffffffffffec0;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  bool type_00;
  int start_00;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  uVar3 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if ((int)(in_ECX + 1) < in_ESI) {
    local_30 = in_ESI + -1;
    while (uVar3 = uVar3 & 0x1ffffff, 0x18 < (int)(local_30 - in_ECX)) {
      iVar2 = in_ECX + (int)(local_30 - in_ECX) / 2;
      start_00 = *(int *)(in_RDI + (long)iVar2 * 4);
      local_2c = in_ECX;
      uVar4 = in_ECX;
      iVar5 = local_30;
      while( true ) {
        if ((uVar3 & 0x1000000) == 0) {
          while( true ) {
            local_1a3 = false;
            if ((int)local_2c < iVar5) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                           in_stack_fffffffffffffe70);
              local_1a3 = boost::multiprecision::operator<=
                                    (in_stack_fffffffffffffe68,
                                     (int *)CONCAT44(in_stack_fffffffffffffe64,in_ECX));
            }
            if (local_1a3 == false) break;
            local_2c = local_2c + 1;
          }
          while( true ) {
            local_1a4 = false;
            if ((int)uVar4 < local_30) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                           in_stack_fffffffffffffe70);
              local_1a4 = boost::multiprecision::operator>
                                    (in_stack_fffffffffffffe68,
                                     (int *)CONCAT44(in_stack_fffffffffffffe64,in_ECX));
            }
            if (local_1a4 == false) break;
            local_30 = local_30 + -1;
          }
        }
        else {
          while( true ) {
            local_1a1 = false;
            if ((int)local_2c < iVar5) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                           in_stack_fffffffffffffe70);
              local_1a1 = boost::multiprecision::operator<
                                    (in_stack_fffffffffffffe68,
                                     (int *)CONCAT44(in_stack_fffffffffffffe64,in_ECX));
            }
            if (local_1a1 == false) break;
            local_2c = local_2c + 1;
          }
          while( true ) {
            local_1a2 = false;
            if ((int)uVar4 < local_30) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                           in_stack_fffffffffffffe70);
              local_1a2 = boost::multiprecision::operator>=
                                    (in_stack_fffffffffffffe68,
                                     (int *)CONCAT44(in_stack_fffffffffffffe64,in_ECX));
            }
            if (local_1a2 == false) break;
            local_30 = local_30 + -1;
          }
        }
        if (local_30 <= (int)local_2c) break;
        in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)(int)local_2c * 4);
        *(undefined4 *)(in_RDI + (long)(int)local_2c * 4) =
             *(undefined4 *)(in_RDI + (long)local_30 * 4);
        *(undefined4 *)(in_RDI + (long)local_30 * 4) = in_stack_ffffffffffffffd8;
        local_2c = local_2c + 1;
        local_30 = local_30 + -1;
      }
      if ((uVar3 & 0x1000000) == 0) {
        while( true ) {
          local_1a6 = false;
          if ((int)uVar4 < local_30) {
            Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70);
            in_stack_fffffffffffffe64 = 0;
            local_1a6 = boost::multiprecision::operator<=
                                  (in_stack_fffffffffffffe68,(int *)(ulong)in_ECX);
          }
          if (local_1a6 == false) break;
          local_30 = local_30 + -1;
        }
        if (local_30 == iVar5) {
          in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)local_30 * 4);
          *(undefined4 *)(in_RDI + (long)local_30 * 4) = *(undefined4 *)(in_RDI + (long)iVar2 * 4);
          *(undefined4 *)(in_RDI + (long)iVar2 * 4) = in_stack_ffffffffffffffd8;
          local_30 = local_30 + -1;
        }
      }
      else {
        while( true ) {
          local_1a5 = false;
          if ((int)local_2c < iVar5) {
            Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator()(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70);
            local_1a5 = boost::multiprecision::operator>=
                                  (in_stack_fffffffffffffe68,
                                   (int *)CONCAT44(in_stack_fffffffffffffe64,in_ECX));
          }
          if (local_1a5 == false) break;
          local_2c = local_2c + 1;
        }
        if (local_2c == uVar4) {
          in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)(int)local_2c * 4);
          *(undefined4 *)(in_RDI + (long)(int)local_2c * 4) =
               *(undefined4 *)(in_RDI + (long)iVar2 * 4);
          *(undefined4 *)(in_RDI + (long)iVar2 * 4) = in_stack_ffffffffffffffd8;
          local_2c = local_2c + 1;
        }
      }
      type_00 = SUB41((uint)in_stack_ffffffffffffffd8 >> 0x18,0);
      iVar2 = (int)((ulong)in_RDX >> 0x20);
      if ((int)(iVar5 - local_2c) < (int)(local_30 - uVar4)) {
        bVar1 = (int)local_2c < iVar5;
        local_2c = uVar4;
        if (bVar1) {
          SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                    ((int *)CONCAT44(iVar5,in_stack_fffffffffffffff0),iVar2,
                     (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(uVar4,uVar3),start_00,type_00);
          local_2c = uVar4;
        }
      }
      else {
        bVar1 = (int)uVar4 < local_30;
        local_30 = iVar5;
        if (bVar1) {
          SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                    ((int *)CONCAT44(iVar5,in_stack_fffffffffffffff0),iVar2,
                     (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(uVar4,uVar3),start_00,type_00);
          local_30 = iVar5;
        }
      }
      uVar3 = uVar3 ^ 0xff000000;
      in_ECX = local_2c;
    }
    if (0 < (int)(local_30 - in_ECX)) {
      SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffeac);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}